

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

void QUtil::read_file_into_memory(char *filename,shared_ptr<char> *file_buf,size_t *size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  QUtil *pQVar4;
  int iVar5;
  FILE *__stream;
  size_t i;
  size_t sVar6;
  runtime_error *this_00;
  long *plVar7;
  QUtil *this_01;
  long *plVar8;
  size_type *psVar9;
  int in_R8D;
  type ii;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __stream = (FILE *)safe_fopen(filename,"rb");
  fseek(__stream,0,2);
  i = ftello(__stream);
  if ((long)i < 0) {
    QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
  }
  *size = i;
  fseek(__stream,0,0);
  local_f8._M_dataplus._M_p = (pointer)operator_new__(*size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char*,std::default_delete<char[]>,std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length,
             local_f8._M_dataplus._M_p);
  sVar3 = local_f8._M_string_length;
  _Var2._M_p = local_f8._M_dataplus._M_p;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  this = (file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = _Var2._M_p;
  (file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length);
  }
  peVar1 = (file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pQVar4 = (QUtil *)0x0;
  do {
    this_01 = pQVar4;
    sVar6 = fread(this_01 + (long)peVar1,1,*size - (long)this_01,__stream);
    pQVar4 = this_01 + sVar6;
  } while (sVar6 != 0);
  if (this_01 == (QUtil *)*size) {
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    return;
  }
  iVar5 = ferror(__stream);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  if (iVar5 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"premature eof reading file ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_b0 == plVar8) {
      local_a0 = *plVar8;
      lStack_98 = plVar7[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar8;
    }
    local_a8 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_118._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar9) {
      local_118.field_2._M_allocated_capacity = *psVar9;
      local_118.field_2._8_8_ = plVar7[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar9;
    }
    local_118._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uint_to_string_base_abi_cxx11_(&local_70,this_01,10,0,in_R8D);
    std::operator+(&local_50,&local_118,&local_70);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_138._M_dataplus._M_p = (pointer)*plVar7;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar9) {
      local_138.field_2._M_allocated_capacity = *psVar9;
      local_138.field_2._8_8_ = plVar7[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar9;
    }
    local_138._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    uint_to_string_base_abi_cxx11_(&local_90,(QUtil *)*size,10,0,in_R8D);
    std::operator+(&local_f8,&local_138,&local_90);
    std::runtime_error::runtime_error(this_00,(string *)&local_f8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"failure reading file ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_b0 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_118._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_118._M_dataplus._M_p == psVar9) {
    local_118.field_2._M_allocated_capacity = *psVar9;
    local_118.field_2._8_8_ = plVar7[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar9;
  }
  local_118._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uint_to_string_base_abi_cxx11_(&local_70,this_01,10,0,in_R8D);
  std::operator+(&local_50,&local_118,&local_70);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_138._M_dataplus._M_p = (pointer)*plVar7;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar9) {
    local_138.field_2._M_allocated_capacity = *psVar9;
    local_138.field_2._8_8_ = plVar7[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar9;
  }
  local_138._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uint_to_string_base_abi_cxx11_(&local_90,(QUtil *)*size,10,0,in_R8D);
  std::operator+(&local_f8,&local_138,&local_90);
  std::runtime_error::runtime_error(this_00,(string *)&local_f8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QUtil::read_file_into_memory(char const* filename, std::shared_ptr<char>& file_buf, size_t& size)
{
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    fseek(f, 0, SEEK_END);
    size = QIntC::to_size(QUtil::tell(f));
    fseek(f, 0, SEEK_SET);
    file_buf = QUtil::make_shared_array<char>(size);
    char* buf_p = file_buf.get();
    size_t bytes_read = 0;
    size_t len = 0;
    while ((len = fread(buf_p + bytes_read, 1, size - bytes_read, f)) > 0) {
        bytes_read += len;
    }
    if (bytes_read != size) {
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        } else {
            throw std::runtime_error(
                std::string("premature eof reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        }
    }
}